

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O2

void __thiscall wasm::DataFlowOpts::workOn(DataFlowOpts *this,Node *node)

{
  bool bVar1;
  Index IVar2;
  Type TVar3;
  Node *with;
  
  if (((node->type != Expr) || (((node->field_1).expr)->_id != ConstId)) &&
     (IVar2 = DataFlow::Users::getNumUses(&this->nodeUsers,node), IVar2 != 0)) {
    TVar3 = node->type;
    if (TVar3 == Phi) {
      bVar1 = DataFlow::allInputsIdentical(node);
      if (bVar1) {
        with = DataFlow::Node::getValue(node,1);
        if (with->type != Expr) {
          return;
        }
        if (((with->field_1).expr)->_id != ConstId) {
          return;
        }
        replaceAllUsesWith(this,node,with);
        return;
      }
      TVar3 = node->type;
    }
    if ((TVar3 == Expr) && (bVar1 = DataFlow::allInputsConstant(node), bVar1)) {
      if ((node->type == Expr) && (((node->field_1).expr)->_id == ConstId)) {
        __assert_fail("!node->isConst()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                      ,0x69,"void wasm::DataFlowOpts::workOn(DataFlow::Node *)");
      }
      if (1 < (((node->field_1).expr)->type).id) {
        optimizeExprToConstant(this,node);
        return;
      }
    }
  }
  return;
}

Assistant:

void workOn(DataFlow::Node* node) {
    if (node->isConst()) {
      return;
    }
    // If there are no uses, there is no point to work.
    if (nodeUsers.getNumUses(node) == 0) {
      return;
    }
    // Optimize: Look for nodes that we can easily convert into
    // something simpler.
    // TODO: we can expressionify and run full normal opts on that,
    //       then copy the result if it's smaller.
    if (node->isPhi() && DataFlow::allInputsIdentical(node)) {
      // Note we don't need to check for effects when replacing, as in
      // flattened IR expression children are local.gets or consts.
      auto* value = node->getValue(1);
      if (value->isConst()) {
        replaceAllUsesWith(node, value);
      }
    } else if (node->isExpr() && DataFlow::allInputsConstant(node)) {
      assert(!node->isConst());
      // If this is a concrete value (not e.g. an eqz of unreachable),
      // it can definitely be precomputed into a constant.
      if (node->expr->type.isConcrete()) {
        // This can be precomputed.
        // TODO not just all-constant inputs? E.g. i32.mul of 0 and X.
        optimizeExprToConstant(node);
      }
    }
  }